

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL> *this,
          SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Parameter *pPVar3;
  Parameter *pPVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this != other) {
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size = 0;
    reserve(this,(other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).
                 buffer_size);
    if ((other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size == 0) {
      uVar8 = 0;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        pPVar3 = (this->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).ptr;
        pPVar4 = (other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).ptr;
        *(undefined4 *)(&pPVar3->alias_global_variable + lVar6) =
             *(undefined4 *)(&pPVar4->alias_global_variable + lVar6);
        puVar1 = (undefined8 *)((long)&(pPVar4->type).id + lVar6);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar3->type).id + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar7 = uVar7 + 1;
        uVar8 = (other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size
        ;
        lVar6 = lVar6 + 0x14;
      } while (uVar7 < uVar8);
    }
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size = uVar8;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}